

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O3

ASTNode * AST::ASTBuilder::createCustomNode(string *nodeName,Token *token)

{
  pointer pcVar1;
  int iVar2;
  ASTNode *this;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  iVar2 = std::__cxx11::string::compare((char *)nodeName);
  if (iVar2 == 0) {
    this = (ASTNode *)operator_new(200);
    paVar4 = &local_48.field_2;
    pcVar1 = (nodeName->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + nodeName->_M_string_length);
    AddOp::AddOp((AddOp *)this,&local_48,token);
    _Var3._M_p = local_48._M_dataplus._M_p;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)nodeName);
    if (iVar2 == 0) {
      this = (ASTNode *)operator_new(200);
      paVar4 = &local_68.field_2;
      pcVar1 = (nodeName->_M_dataplus)._M_p;
      local_68._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + nodeName->_M_string_length);
      ArrayDim::ArrayDim((ArrayDim *)this,&local_68,token);
      _Var3._M_p = local_68._M_dataplus._M_p;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)nodeName);
      if (iVar2 == 0) {
        this = (ASTNode *)operator_new(200);
        paVar4 = &local_88.field_2;
        pcVar1 = (nodeName->_M_dataplus)._M_p;
        local_88._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar1,pcVar1 + nodeName->_M_string_length);
        AssignOp::AssignOp((AssignOp *)this,&local_88,token);
        _Var3._M_p = local_88._M_dataplus._M_p;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)nodeName);
        if (iVar2 == 0) {
          this = (ASTNode *)operator_new(200);
          paVar4 = &local_a8.field_2;
          pcVar1 = (nodeName->_M_dataplus)._M_p;
          local_a8._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,pcVar1,pcVar1 + nodeName->_M_string_length);
          Calls::Calls((Calls *)this,&local_a8,token);
          _Var3._M_p = local_a8._M_dataplus._M_p;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)nodeName);
          if (iVar2 == 0) {
            this = (ASTNode *)operator_new(200);
            paVar4 = &local_c8.field_2;
            pcVar1 = (nodeName->_M_dataplus)._M_p;
            local_c8._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,pcVar1,pcVar1 + nodeName->_M_string_length);
            Call::Call((Call *)this,&local_c8,token);
            _Var3._M_p = local_c8._M_dataplus._M_p;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)nodeName);
            if (iVar2 == 0) {
              this = (ASTNode *)operator_new(200);
              paVar4 = &local_e8.field_2;
              pcVar1 = (nodeName->_M_dataplus)._M_p;
              local_e8._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,pcVar1,pcVar1 + nodeName->_M_string_length);
              ClassDecls::ClassDecls((ClassDecls *)this,&local_e8,token);
              _Var3._M_p = local_e8._M_dataplus._M_p;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)nodeName);
              if (iVar2 == 0) {
                this = (ASTNode *)operator_new(200);
                paVar4 = &local_108.field_2;
                pcVar1 = (nodeName->_M_dataplus)._M_p;
                local_108._M_dataplus._M_p = (pointer)paVar4;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_108,pcVar1,pcVar1 + nodeName->_M_string_length);
                ClassDecl::ClassDecl((ClassDecl *)this,&local_108,token);
                _Var3._M_p = local_108._M_dataplus._M_p;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)nodeName);
                if (iVar2 == 0) {
                  this = (ASTNode *)operator_new(200);
                  paVar4 = &local_128.field_2;
                  pcVar1 = (nodeName->_M_dataplus)._M_p;
                  local_128._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_128,pcVar1,pcVar1 + nodeName->_M_string_length);
                  CompareOp::CompareOp((CompareOp *)this,&local_128,token);
                  _Var3._M_p = local_128._M_dataplus._M_p;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)nodeName);
                  if (iVar2 == 0) {
                    this = (ASTNode *)operator_new(200);
                    paVar4 = &local_148.field_2;
                    pcVar1 = (nodeName->_M_dataplus)._M_p;
                    local_148._M_dataplus._M_p = (pointer)paVar4;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_148,pcVar1,pcVar1 + nodeName->_M_string_length);
                    FuncBody::FuncBody((FuncBody *)this,&local_148,token);
                    _Var3._M_p = local_148._M_dataplus._M_p;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)nodeName);
                    if (iVar2 == 0) {
                      this = (ASTNode *)operator_new(200);
                      paVar4 = &local_168.field_2;
                      pcVar1 = (nodeName->_M_dataplus)._M_p;
                      local_168._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_168,pcVar1,pcVar1 + nodeName->_M_string_length);
                      FuncCall::FuncCall((FuncCall *)this,&local_168,token);
                      _Var3._M_p = local_168._M_dataplus._M_p;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)nodeName);
                      if (iVar2 == 0) {
                        this = (ASTNode *)operator_new(200);
                        paVar4 = &local_188.field_2;
                        pcVar1 = (nodeName->_M_dataplus)._M_p;
                        local_188._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_188,pcVar1,pcVar1 + nodeName->_M_string_length);
                        FuncDef::FuncDef((FuncDef *)this,&local_188,token);
                        _Var3._M_p = local_188._M_dataplus._M_p;
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)nodeName);
                        if (iVar2 == 0) {
                          this = (ASTNode *)operator_new(200);
                          paVar4 = &local_1a8.field_2;
                          pcVar1 = (nodeName->_M_dataplus)._M_p;
                          local_1a8._M_dataplus._M_p = (pointer)paVar4;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_1a8,pcVar1,pcVar1 + nodeName->_M_string_length
                                    );
                          FuncDecl::FuncDecl((FuncDecl *)this,&local_1a8,token);
                          _Var3._M_p = local_1a8._M_dataplus._M_p;
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)nodeName);
                          if (iVar2 == 0) {
                            this = (ASTNode *)operator_new(200);
                            paVar4 = &local_1c8.field_2;
                            pcVar1 = (nodeName->_M_dataplus)._M_p;
                            local_1c8._M_dataplus._M_p = (pointer)paVar4;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_1c8,pcVar1,
                                       pcVar1 + nodeName->_M_string_length);
                            FuncParams::FuncParams((FuncParams *)this,&local_1c8,token);
                            _Var3._M_p = local_1c8._M_dataplus._M_p;
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)nodeName);
                            if (iVar2 == 0) {
                              this = (ASTNode *)operator_new(200);
                              paVar4 = &local_1e8.field_2;
                              pcVar1 = (nodeName->_M_dataplus)._M_p;
                              local_1e8._M_dataplus._M_p = (pointer)paVar4;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_1e8,pcVar1,
                                         pcVar1 + nodeName->_M_string_length);
                              FuncCallParams::FuncCallParams
                                        ((FuncCallParams *)this,&local_1e8,token);
                              _Var3._M_p = local_1e8._M_dataplus._M_p;
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare((char *)nodeName);
                              if (iVar2 == 0) {
                                this = (ASTNode *)operator_new(200);
                                paVar4 = &local_208.field_2;
                                pcVar1 = (nodeName->_M_dataplus)._M_p;
                                local_208._M_dataplus._M_p = (pointer)paVar4;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_208,pcVar1,
                                           pcVar1 + nodeName->_M_string_length);
                                If::If((If *)this,&local_208,token);
                                _Var3._M_p = local_208._M_dataplus._M_p;
                              }
                              else {
                                iVar2 = std::__cxx11::string::compare((char *)nodeName);
                                if (iVar2 == 0) {
                                  this = (ASTNode *)operator_new(200);
                                  paVar4 = &local_228.field_2;
                                  pcVar1 = (nodeName->_M_dataplus)._M_p;
                                  local_228._M_dataplus._M_p = (pointer)paVar4;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)&local_228,pcVar1,
                                             pcVar1 + nodeName->_M_string_length);
                                  Local::Local((Local *)this,&local_228,token);
                                  _Var3._M_p = local_228._M_dataplus._M_p;
                                }
                                else {
                                  iVar2 = std::__cxx11::string::compare((char *)nodeName);
                                  if (iVar2 == 0) {
                                    this = (ASTNode *)operator_new(200);
                                    paVar4 = &local_248.field_2;
                                    pcVar1 = (nodeName->_M_dataplus)._M_p;
                                    local_248._M_dataplus._M_p = (pointer)paVar4;
                                    std::__cxx11::string::_M_construct<char*>
                                              ((string *)&local_248,pcVar1,
                                               pcVar1 + nodeName->_M_string_length);
                                    MainFunc::MainFunc((MainFunc *)this,&local_248,token);
                                    _Var3._M_p = local_248._M_dataplus._M_p;
                                  }
                                  else {
                                    iVar2 = std::__cxx11::string::compare((char *)nodeName);
                                    if (iVar2 == 0) {
                                      this = (ASTNode *)operator_new(200);
                                      paVar4 = &local_268.field_2;
                                      pcVar1 = (nodeName->_M_dataplus)._M_p;
                                      local_268._M_dataplus._M_p = (pointer)paVar4;
                                      std::__cxx11::string::_M_construct<char*>
                                                ((string *)&local_268,pcVar1,
                                                 pcVar1 + nodeName->_M_string_length);
                                      MultOp::MultOp((MultOp *)this,&local_268,token);
                                      _Var3._M_p = local_268._M_dataplus._M_p;
                                    }
                                    else {
                                      iVar2 = std::__cxx11::string::compare((char *)nodeName);
                                      if (iVar2 == 0) {
                                        this = (ASTNode *)operator_new(200);
                                        paVar4 = &local_288.field_2;
                                        pcVar1 = (nodeName->_M_dataplus)._M_p;
                                        local_288._M_dataplus._M_p = (pointer)paVar4;
                                        std::__cxx11::string::_M_construct<char*>
                                                  ((string *)&local_288,pcVar1,
                                                   pcVar1 + nodeName->_M_string_length);
                                        Number::Number((Number *)this,&local_288,token);
                                        _Var3._M_p = local_288._M_dataplus._M_p;
                                      }
                                      else {
                                        iVar2 = std::__cxx11::string::compare((char *)nodeName);
                                        if (iVar2 == 0) {
                                          this = (ASTNode *)operator_new(200);
                                          paVar4 = &local_2a8.field_2;
                                          pcVar1 = (nodeName->_M_dataplus)._M_p;
                                          local_2a8._M_dataplus._M_p = (pointer)paVar4;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&local_2a8,pcVar1,
                                                     pcVar1 + nodeName->_M_string_length);
                                          Program::Program((Program *)this,&local_2a8,token);
                                          _Var3._M_p = local_2a8._M_dataplus._M_p;
                                        }
                                        else {
                                          iVar2 = std::__cxx11::string::compare((char *)nodeName);
                                          if (iVar2 == 0) {
                                            this = (ASTNode *)operator_new(200);
                                            paVar4 = &local_2c8.field_2;
                                            pcVar1 = (nodeName->_M_dataplus)._M_p;
                                            local_2c8._M_dataplus._M_p = (pointer)paVar4;
                                            std::__cxx11::string::_M_construct<char*>
                                                      ((string *)&local_2c8,pcVar1,
                                                       pcVar1 + nodeName->_M_string_length);
                                            Read::Read((Read *)this,&local_2c8,token);
                                            _Var3._M_p = local_2c8._M_dataplus._M_p;
                                          }
                                          else {
                                            iVar2 = std::__cxx11::string::compare((char *)nodeName);
                                            if (iVar2 == 0) {
                                              this = (ASTNode *)operator_new(200);
                                              paVar4 = &local_2e8.field_2;
                                              pcVar1 = (nodeName->_M_dataplus)._M_p;
                                              local_2e8._M_dataplus._M_p = (pointer)paVar4;
                                              std::__cxx11::string::_M_construct<char*>
                                                        ((string *)&local_2e8,pcVar1,
                                                         pcVar1 + nodeName->_M_string_length);
                                              Return::Return((Return *)this,&local_2e8,token);
                                              _Var3._M_p = local_2e8._M_dataplus._M_p;
                                            }
                                            else {
                                              iVar2 = std::__cxx11::string::compare
                                                                ((char *)nodeName);
                                              if (iVar2 == 0) {
                                                this = (ASTNode *)operator_new(200);
                                                paVar4 = &local_308.field_2;
                                                pcVar1 = (nodeName->_M_dataplus)._M_p;
                                                local_308._M_dataplus._M_p = (pointer)paVar4;
                                                std::__cxx11::string::_M_construct<char*>
                                                          ((string *)&local_308,pcVar1,
                                                           pcVar1 + nodeName->_M_string_length);
                                                Sign::Sign((Sign *)this,&local_308,token);
                                                _Var3._M_p = local_308._M_dataplus._M_p;
                                              }
                                              else {
                                                iVar2 = std::__cxx11::string::compare
                                                                  ((char *)nodeName);
                                                if (iVar2 != 0) {
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)nodeName);
                                                  if (iVar2 != 0) {
                                                    iVar2 = std::__cxx11::string::compare
                                                                      ((char *)nodeName);
                                                    if (iVar2 == 0) {
                                                      this = (ASTNode *)operator_new(200);
                                                      paVar4 = &local_348.field_2;
                                                      pcVar1 = (nodeName->_M_dataplus)._M_p;
                                                      local_348._M_dataplus._M_p = (pointer)paVar4;
                                                      std::__cxx11::string::_M_construct<char*>
                                                                ((string *)&local_348,pcVar1,
                                                                 pcVar1 + nodeName->_M_string_length
                                                                );
                                                      VarDecl::VarDecl((VarDecl *)this,&local_348,
                                                                       token);
                                                      _Var3._M_p = local_348._M_dataplus._M_p;
                                                    }
                                                    else {
                                                      iVar2 = std::__cxx11::string::compare
                                                                        ((char *)nodeName);
                                                      if (iVar2 == 0) {
                                                        this = (ASTNode *)operator_new(200);
                                                        paVar4 = &local_368.field_2;
                                                        pcVar1 = (nodeName->_M_dataplus)._M_p;
                                                        local_368._M_dataplus._M_p = (pointer)paVar4
                                                        ;
                                                        std::__cxx11::string::_M_construct<char*>
                                                                  ((string *)&local_368,pcVar1,
                                                                   pcVar1 + nodeName->
                                                                            _M_string_length);
                                                        While::While((While *)this,&local_368,token)
                                                        ;
                                                        _Var3._M_p = local_368._M_dataplus._M_p;
                                                      }
                                                      else {
                                                        iVar2 = std::__cxx11::string::compare
                                                                          ((char *)nodeName);
                                                        this = (ASTNode *)operator_new(200);
                                                        if (iVar2 == 0) {
                                                          paVar4 = &local_388.field_2;
                                                          pcVar1 = (nodeName->_M_dataplus)._M_p;
                                                          local_388._M_dataplus._M_p =
                                                               (pointer)paVar4;
                                                          std::__cxx11::string::_M_construct<char*>
                                                                    ((string *)&local_388,pcVar1,
                                                                     pcVar1 + nodeName->
                                                                              _M_string_length);
                                                          Write::Write((Write *)this,&local_388,
                                                                       token);
                                                          _Var3._M_p = local_388._M_dataplus._M_p;
                                                        }
                                                        else {
                                                          paVar4 = &local_3a8.field_2;
                                                          pcVar1 = (nodeName->_M_dataplus)._M_p;
                                                          local_3a8._M_dataplus._M_p =
                                                               (pointer)paVar4;
                                                          std::__cxx11::string::_M_construct<char*>
                                                                    ((string *)&local_3a8,pcVar1,
                                                                     pcVar1 + nodeName->
                                                                              _M_string_length);
                                                          ASTNode::ASTNode(this,&local_3a8,token);
                                                          _Var3._M_p = local_3a8._M_dataplus._M_p;
                                                        }
                                                      }
                                                    }
                                                    goto LAB_0012308c;
                                                  }
                                                }
                                                this = (ASTNode *)operator_new(200);
                                                paVar4 = &local_328.field_2;
                                                pcVar1 = (nodeName->_M_dataplus)._M_p;
                                                local_328._M_dataplus._M_p = (pointer)paVar4;
                                                std::__cxx11::string::_M_construct<char*>
                                                          ((string *)&local_328,pcVar1,
                                                           pcVar1 + nodeName->_M_string_length);
                                                Statements::Statements
                                                          ((Statements *)this,&local_328,token);
                                                _Var3._M_p = local_328._M_dataplus._M_p;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012308c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p,paVar4->_M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

AST::ASTNode *AST::ASTBuilder::createCustomNode(std::string &nodeName, Token *token) {
    if (nodeName == "add") return new AddOp(nodeName, token);
    else if (nodeName == "ARRAYDIMENSIONS") return new ArrayDim(nodeName, token);
    else if (nodeName == "=") return new AssignOp(nodeName, token);
    else if (nodeName == "calls") return new Calls(nodeName, token);
    else if (nodeName == "call") return new Call(nodeName, token);
    else if (nodeName == "classes") return new ClassDecls(nodeName, token);
    else if (nodeName == "class") return new ClassDecl(nodeName, token);
    else if (nodeName == "cmp") return new CompareOp(nodeName, token);
    else if (nodeName == "func_body") return new FuncBody(nodeName, token);
    else if (nodeName == "func_call") return new FuncCall(nodeName, token);
    else if (nodeName == "func_def") return new FuncDef(nodeName, token);
    else if (nodeName == "func_decl") return new FuncDecl(nodeName, token);
    else if (nodeName == "params") return new FuncParams(nodeName, token);
    else if (nodeName == "params_call") return new FuncCallParams(nodeName, token);
    else if (nodeName == "if") return new If(nodeName, token);
    else if (nodeName == "LOCALSCOPE") return new Local(nodeName, token);
    else if (nodeName == "main") return new MainFunc(nodeName, token);
    else if (nodeName == "mult") return new MultOp(nodeName, token);
    else if (nodeName == "number") return new Number(nodeName, token);
    else if (nodeName == "PROGRAM") return new Program(nodeName, token);
    else if (nodeName == "read") return new Read(nodeName, token);
    else if (nodeName == "return") return new Return(nodeName, token);
    else if (nodeName == "sign") return new Sign(nodeName, token);
    else if (nodeName == "STATEMENTS" || nodeName == "STATEMENTBLOCK") return new Statements(nodeName, token);
    else if (nodeName == "variable") return new VarDecl(nodeName, token);
    else if (nodeName == "while") return new While(nodeName, token);
    else if (nodeName == "write") return new Write(nodeName, token);
    else return new ASTNode(nodeName, token);
}